

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,signed_char,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  ulong uVar2;
  FunctionData *pFVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t iVar9;
  AggregateUnaryInput input_data;
  ulong local_90;
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      local_90 = 0;
      uVar8 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar4 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar4 = count;
          }
LAB_0055304d:
          uVar5 = uVar8;
          if (uVar8 < uVar4) {
            do {
              BaseModeFunction<duckdb::ModeStandard<signed_char>>::
              Execute<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
                        ((ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *)state,
                         (char *)(uVar8 + lVar1),aggr_input_data);
              uVar8 = uVar8 + 1;
              uVar5 = uVar4;
            } while (uVar4 != uVar8);
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)(input + 0x28) + local_90 * 8);
          uVar4 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar4 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto LAB_0055304d;
          uVar5 = uVar4;
          if ((uVar2 != 0) && (uVar5 = uVar8, uVar8 < uVar4)) {
            uVar6 = 0;
            do {
              if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<signed_char>>::
                Execute<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
                          ((ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *)state,
                           (char *)(uVar8 + lVar1 + uVar6),aggr_input_data);
              }
              uVar6 = uVar6 + 1;
              uVar5 = uVar4;
            } while (uVar4 - uVar8 != uVar6);
          }
        }
        local_90 = local_90 + 1;
        uVar8 = uVar5;
      } while (local_90 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<signed_char>>::
      ConstantOperation<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
                ((ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *)state,
                 *(char **)(input + 0x20),&local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar3 = ((local_78.input)->bind_data).ptr;
        iVar9 = 0;
        do {
          iVar7 = iVar9;
          if (pFVar3 != (FunctionData *)0x0) {
            iVar7 = (idx_t)*(uint *)(pFVar3 + iVar9 * 4);
          }
          BaseModeFunction<duckdb::ModeStandard<signed_char>>::
          Execute<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
                    ((ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *)state,
                     (char *)((long)&((local_78.input_mask)->
                                     super_TemplatedValidityMask<unsigned_long>).validity_mask +
                             iVar7),aggr_input_data);
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      pFVar3 = ((local_78.input)->bind_data).ptr;
      iVar9 = 0;
      do {
        iVar7 = iVar9;
        if (pFVar3 != (FunctionData *)0x0) {
          iVar7 = (idx_t)*(uint *)(pFVar3 + iVar9 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<signed_char>>::
          Execute<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
                    ((ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *)state,
                     (char *)((long)&((local_78.input_mask)->
                                     super_TemplatedValidityMask<unsigned_long>).validity_mask +
                             iVar7),aggr_input_data);
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}